

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O1

void __thiscall
slang::driver::SourceLoader::SourceLoader(SourceLoader *this,SourceManager *sourceManager)

{
  char_pointer puVar1;
  flat_hash_set<std::string_view> *arrays_;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  ulong uVar4;
  group_type_pointer pgVar5;
  value_type_pointer pbVar6;
  int iVar7;
  uint uVar8;
  _Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  *p_Var9;
  uint64_t uVar10;
  char_pointer puVar11;
  value_type_pointer ppVar12;
  value_type *elements_1;
  long lVar13;
  ulong uVar14;
  table_element_pointer pbVar15;
  uint uVar16;
  value_type_pointer ppVar17;
  ulong uVar18;
  ulong pos0;
  size_t sVar19;
  char_pointer puVar20;
  bool bVar21;
  uchar uVar22;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  iterator iVar29;
  locator res;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_t *local_80;
  undefined1 local_78 [32];
  ulong local_58;
  SyntaxTreeList *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *local_40;
  deque<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  *local_38;
  
  this->sourceManager = sourceManager;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.groups_size_mask = 1;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar17 = (this->fileIndex).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
            .arrays.elements_;
  sVar19 = 0x1d;
  if (ppVar17 != (value_type_pointer)0x0) {
    ppVar17 = (value_type_pointer)0x1d;
  }
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .size_ctrl.ml = (size_t)ppVar17;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .size_ctrl.size = 0;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar12 = (this->libraries).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
            .arrays.elements_;
  if (ppVar12 != (value_type_pointer)0x0) {
    ppVar12 = (value_type_pointer)0x1d;
  }
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .size_ctrl.ml = (size_t)ppVar12;
  local_38 = &this->unitEntries;
  *(undefined1 (*) [16])
   &(this->libraries).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  (this->unitEntries).
  super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->unitEntries).
  super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  p_Var9 = &(this->unitEntries).
            super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ;
  (p_Var9->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (p_Var9->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  *(undefined1 (*) [16])
   &(this->unitEntries).
    super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = (undefined1  [16])0x0;
  p_Var9 = &(this->unitEntries).
            super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ;
  (p_Var9->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (p_Var9->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->unitEntries).
  super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ::_M_initialize_map(&local_38->
                       super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
                      ,0);
  local_40 = &this->searchDirectories;
  (this->searchExtensions).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->searchExtensions).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->searchDirectories).
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->searchDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->searchDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_mask = 1;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  if ((this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar19 = 0;
  }
  arrays_ = &this->uniqueExtensions;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.ml = sVar19;
  local_80 = &(this->uniqueExtensions).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .size_ctrl.size;
  local_48 = &this->errors;
  local_50 = &this->libraryMapTrees;
  *(undefined1 (*) [16])
   &(this->uniqueExtensions).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->libraryMapTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->libraryMapTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->libraryMapTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._M_len = 2;
  local_90._M_str = ".v";
  uVar10 = detail::hashing::hash(".v",2);
  uVar4 = (this->uniqueExtensions).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .arrays.groups_size_mask;
  pgVar5 = (this->uniqueExtensions).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar10 & 0xff];
  pbVar6 = (this->uniqueExtensions).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
           .arrays.elements_;
  uVar18 = 0;
  uVar14 = uVar10 >> 0x3f;
  do {
    pgVar2 = pgVar5 + uVar14;
    uVar22 = (uchar)uVar3;
    auVar27[0] = -(pgVar2->m[0].n == uVar22);
    uVar24 = (uchar)((uint)uVar3 >> 8);
    auVar27[1] = -(pgVar2->m[1].n == uVar24);
    uVar25 = (uchar)((uint)uVar3 >> 0x10);
    auVar27[2] = -(pgVar2->m[2].n == uVar25);
    uVar26 = (uchar)((uint)uVar3 >> 0x18);
    auVar27[3] = -(pgVar2->m[3].n == uVar26);
    auVar27[4] = -(pgVar2->m[4].n == uVar22);
    auVar27[5] = -(pgVar2->m[5].n == uVar24);
    auVar27[6] = -(pgVar2->m[6].n == uVar25);
    auVar27[7] = -(pgVar2->m[7].n == uVar26);
    auVar27[8] = -(pgVar2->m[8].n == uVar22);
    auVar27[9] = -(pgVar2->m[9].n == uVar24);
    auVar27[10] = -(pgVar2->m[10].n == uVar25);
    auVar27[0xb] = -(pgVar2->m[0xb].n == uVar26);
    auVar27[0xc] = -(pgVar2->m[0xc].n == uVar22);
    auVar27[0xd] = -(pgVar2->m[0xd].n == uVar24);
    auVar27[0xe] = -(pgVar2->m[0xe].n == uVar25);
    auVar27[0xf] = -(pgVar2->m[0xf].n == uVar26);
    for (uVar16 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe); uVar16 != 0;
        uVar16 = uVar16 - 1 & uVar16) {
      iVar7 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
        }
      }
      lVar13 = (long)&pbVar6[uVar14 * 0xf]._M_len + (ulong)(uint)(iVar7 << 4);
      if (*(long *)((long)&pbVar6[uVar14 * 0xf]._M_len + (ulong)(uint)(iVar7 << 4)) == 2) {
        bVar21 = **(short **)(lVar13 + 8) == 0x762e;
      }
      else {
        bVar21 = false;
      }
      if (bVar21) goto LAB_001a3fba;
    }
    if ((pgVar5[uVar14].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7]) == 0) break;
    lVar13 = uVar14 + uVar18;
    uVar18 = uVar18 + 1;
    uVar14 = lVar13 + 1U & uVar4;
  } while (uVar18 <= uVar4);
  lVar13 = 0;
LAB_001a3fba:
  if (lVar13 == 0) {
    if ((this->uniqueExtensions).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        (this->uniqueExtensions).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_78,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)arrays_,(arrays_type *)arrays_,uVar10 >> 0x3f,uVar10,&local_90);
      *local_80 = *local_80 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_78,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)arrays_,uVar10,&local_90);
    }
  }
  local_90._M_len = 3;
  local_90._M_str = ".sv";
  uVar10 = detail::hashing::hash(".sv",3);
  pos0 = uVar10 >> ((byte)(this->uniqueExtensions).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_size_index & 0x3f);
  pgVar5 = (this->uniqueExtensions).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar10 & 0xff];
  pbVar6 = (this->uniqueExtensions).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
           .arrays.elements_;
  uVar4 = (this->uniqueExtensions).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .arrays.groups_size_mask;
  uVar18 = 0;
  uVar14 = pos0;
  do {
    pgVar2 = pgVar5 + uVar14;
    uVar22 = (uchar)uVar3;
    auVar28[0] = -(pgVar2->m[0].n == uVar22);
    uVar24 = (uchar)((uint)uVar3 >> 8);
    auVar28[1] = -(pgVar2->m[1].n == uVar24);
    uVar25 = (uchar)((uint)uVar3 >> 0x10);
    auVar28[2] = -(pgVar2->m[2].n == uVar25);
    uVar26 = (uchar)((uint)uVar3 >> 0x18);
    auVar28[3] = -(pgVar2->m[3].n == uVar26);
    auVar28[4] = -(pgVar2->m[4].n == uVar22);
    auVar28[5] = -(pgVar2->m[5].n == uVar24);
    auVar28[6] = -(pgVar2->m[6].n == uVar25);
    auVar28[7] = -(pgVar2->m[7].n == uVar26);
    auVar28[8] = -(pgVar2->m[8].n == uVar22);
    auVar28[9] = -(pgVar2->m[9].n == uVar24);
    auVar28[10] = -(pgVar2->m[10].n == uVar25);
    auVar28[0xb] = -(pgVar2->m[0xb].n == uVar26);
    auVar28[0xc] = -(pgVar2->m[0xc].n == uVar22);
    auVar28[0xd] = -(pgVar2->m[0xd].n == uVar24);
    auVar28[0xe] = -(pgVar2->m[0xe].n == uVar25);
    auVar28[0xf] = -(pgVar2->m[0xf].n == uVar26);
    for (uVar16 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe); uVar16 != 0;
        uVar16 = uVar16 - 1 & uVar16) {
      iVar7 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
        }
      }
      lVar13 = (long)&pbVar6[uVar14 * 0xf]._M_len + (ulong)(uint)(iVar7 << 4);
      if (*(long *)((long)&pbVar6[uVar14 * 0xf]._M_len + (ulong)(uint)(iVar7 << 4)) == 3) {
        bVar21 = (char)(*(short **)(lVar13 + 8))[1] == 'v' && **(short **)(lVar13 + 8) == 0x732e;
      }
      else {
        bVar21 = false;
      }
      local_58 = uVar18;
      if (bVar21) goto LAB_001a412e;
    }
    if ((pgVar5[uVar14].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7]) == 0) break;
    lVar13 = uVar14 + uVar18;
    uVar18 = uVar18 + 1;
    uVar14 = lVar13 + 1U & uVar4;
  } while (uVar18 <= uVar4);
  lVar13 = 0;
LAB_001a412e:
  if (lVar13 == 0) {
    if ((this->uniqueExtensions).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        (this->uniqueExtensions).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_78,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)arrays_,(arrays_type *)arrays_,pos0,uVar10,&local_90);
      *local_80 = *local_80 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_78,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)arrays_,uVar10,&local_90);
    }
  }
  iVar29 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin(&arrays_->table_);
  if (iVar29.p_ == (table_element_pointer)0x0) {
    return;
  }
LAB_001a418c:
  local_78._0_8_ = (iVar29.p_)->_M_len;
  local_78._8_8_ = (iVar29.p_)->_M_str;
  std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
              *)&this->searchExtensions,(basic_string_view<char,_std::char_traits<char>_> *)local_78
            );
  puVar11 = iVar29.pc_ + 2;
  do {
    puVar20 = puVar11;
    puVar11 = iVar29.pc_;
    pbVar15 = iVar29.p_ + 1;
    if (((uint)iVar29.pc_ & 0xf) == 0xe) goto LAB_001a41da;
    puVar1 = puVar20 + -1;
    iVar29.p_ = pbVar15;
    iVar29.pc_ = puVar11 + 1;
    puVar11 = puVar20 + 1;
  } while (*puVar1 == '\0');
  puVar20 = puVar20 + -1;
  if (*puVar1 == '\x01') {
    pbVar15 = (table_element_pointer)0x0;
  }
  goto LAB_001a41cf;
LAB_001a41da:
  do {
    auVar23[0] = -(*puVar20 == '\0');
    auVar23[1] = -(puVar20[1] == '\0');
    auVar23[2] = -(puVar20[2] == '\0');
    auVar23[3] = -(puVar20[3] == '\0');
    auVar23[4] = -(puVar20[4] == '\0');
    auVar23[5] = -(puVar20[5] == '\0');
    auVar23[6] = -(puVar20[6] == '\0');
    auVar23[7] = -(puVar20[7] == '\0');
    auVar23[8] = -(puVar20[8] == '\0');
    auVar23[9] = -(puVar20[9] == '\0');
    auVar23[10] = -(puVar20[10] == '\0');
    auVar23[0xb] = -(puVar20[0xb] == '\0');
    auVar23[0xc] = -(puVar20[0xc] == '\0');
    auVar23[0xd] = -(puVar20[0xd] == '\0');
    auVar23[0xe] = -(puVar20[0xe] == '\0');
    auVar23[0xf] = -(puVar20[0xf] == '\0');
    uVar16 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
    if (uVar16 == 0x7fff) {
      puVar20 = puVar20 + 0x10;
      pbVar15 = pbVar15 + 0xf;
    }
    else {
      uVar8 = 0;
      if ((uVar16 ^ 0x7fff) != 0) {
        for (; ((uVar16 ^ 0x7fff) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      if (puVar20[uVar8] == '\x01') {
        pbVar15 = (table_element_pointer)0x0;
      }
      else {
        puVar20 = puVar20 + uVar8;
        pbVar15 = (table_element_pointer)((long)&pbVar15->_M_len + (ulong)(uVar8 << 4));
      }
    }
  } while (uVar16 == 0x7fff);
LAB_001a41cf:
  iVar29.p_ = pbVar15;
  iVar29.pc_ = puVar20;
  if (pbVar15 == (table_element_pointer)0x0) {
    return;
  }
  goto LAB_001a418c;
}

Assistant:

SourceLoader::SourceLoader(SourceManager& sourceManager) : sourceManager(sourceManager) {
    // When searching for library modules we will always include these extensions
    // in addition to anything the user provides.
    uniqueExtensions.emplace(".v"sv);
    uniqueExtensions.emplace(".sv"sv);
    for (auto ext : uniqueExtensions)
        searchExtensions.emplace_back(ext);
}